

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

bool nullcInitTypeinfoModule(Linker *linker)

{
  nullres nVar1;
  
  NULLCTypeInfo::linker = linker;
  nVar1 = nullcBindModuleFunctionWrapper
                    ("std.typeinfo",NULLCTypeInfo::IsFunction,nullcWrapCall1<int,int>,"isFunction",0
                    );
  if (nVar1 == '\0') {
    return false;
  }
  nVar1 = nullcBindModuleFunctionWrapper
                    ("std.typeinfo",NULLCTypeInfo::IsFunctionRef,nullcWrapCall1<int,NULLCRef>,
                     "isFunction",1);
  if (nVar1 != '\0') {
    nVar1 = nullcBindModuleFunctionWrapper
                      ("std.typeinfo",NULLCTypeInfo::IsClass,nullcWrapCall1<int,int>,"isClass",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionWrapper
                      ("std.typeinfo",NULLCTypeInfo::IsClassRef,nullcWrapCall1<int,NULLCRef>,
                       "isClass",1);
    if (nVar1 != '\0') {
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.typeinfo",NULLCTypeInfo::IsSimple,nullcWrapCall1<int,int>,"isSimple",0
                        );
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionWrapper
                        ("std.typeinfo",NULLCTypeInfo::IsSimpleRef,nullcWrapCall1<int,NULLCRef>,
                         "isSimple",1);
      if (nVar1 != '\0') {
        nVar1 = nullcBindModuleFunctionWrapper
                          ("std.typeinfo",NULLCTypeInfo::IsArray,nullcWrapCall1<int,int>,"isArray",0
                          );
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionWrapper
                          ("std.typeinfo",NULLCTypeInfo::IsArrayRef,nullcWrapCall1<int,NULLCRef>,
                           "isArray",1);
        if (nVar1 != '\0') {
          nVar1 = nullcBindModuleFunctionWrapper
                            ("std.typeinfo",NULLCTypeInfo::IsPointer,nullcWrapCall1<int,int>,
                             "isPointer",0);
          if (nVar1 == '\0') {
            return false;
          }
          nVar1 = nullcBindModuleFunctionWrapper
                            ("std.typeinfo",NULLCTypeInfo::IsPointerRef,nullcWrapCall1<int,NULLCRef>
                             ,"isPointer",1);
          if (nVar1 != '\0') {
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::MemberCount,nullcWrapCall1<int,int*>,
                               "typeid::memberCount",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::MemberType,
                               nullcWrapCall2<NULLCTypeInfo::TypeID,int,int*>,"typeid::memberType",0
                              );
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::MemberName,
                               nullcWrapCall2<NULLCArray,int,int*>,"typeid::memberName",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::TypeName,
                               nullcWrapCall1<NULLCArray,int*>,"typeid::name$",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::TypeSubType,
                               nullcWrapCall1<NULLCTypeInfo::TypeID,int*>,"typeid::subType",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::TypeArraySize,nullcWrapCall1<int,int*>,
                               "typeid::arraySize",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::TypeReturnType,
                               nullcWrapCall1<NULLCTypeInfo::TypeID,int*>,"typeid::returnType",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::TypeArgumentCount,
                               nullcWrapCall1<int,int*>,"typeid::argumentCount",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::TypeArgumentType,
                               nullcWrapCall2<NULLCTypeInfo::TypeID,int,int*>,"typeid::argumentType"
                               ,0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::MemberByIndex,
                               nullcWrapCall2<NULLCRef,NULLCRef,int>,"typeGetMember",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionWrapper
                              ("std.typeinfo",NULLCTypeInfo::MemberByName,
                               nullcWrapCall2<NULLCRef,NULLCRef,NULLCArray>,"typeGetMember",1);
            if (nVar1 != '\0') {
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetPointerTarget,
                                 nullcWrapCall1<NULLCRef,NULLCRef>,"pointerGetTarget",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetType,
                                 nullcWrapCall1<NULLCTypeInfo::TypeID,NULLCArray>,"getType",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetInstanceByName,
                                 nullcWrapCall1<NULLCRef,NULLCArray>,"createInstanceByName",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetInstanceByType,
                                 nullcWrapCall1<NULLCRef,NULLCTypeInfo::TypeID>,
                                 "createInstanceByType",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetArrayByName,
                                 nullcWrapCall2<NULLCAutoArray,NULLCArray,unsigned_int>,
                                 "createArrayByName",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetArrayByType,
                                 nullcWrapCall2<NULLCAutoArray,NULLCTypeInfo::TypeID,unsigned_int>,
                                 "createArrayByType",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetFunctionContextType,
                                 nullcWrapCall1<NULLCTypeInfo::TypeID,NULLCRef>,
                                 "functionGetContextType",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::GetFunctionContext,
                                 nullcWrapCall1<NULLCRef,NULLCRef>,"functionGetContext",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionWrapper
                                ("std.typeinfo",NULLCTypeInfo::SetFunctionContext,
                                 nullcWrapCall2<void,NULLCRef,NULLCRef>,"functionSetContext",0);
              return nVar1 != '\0';
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool	nullcInitTypeinfoModule(Linker* linker)
{
	NULLCTypeInfo::linker = linker;

	REGISTER_FUNC(IsFunction, "isFunction", 0);
	REGISTER_FUNC(IsFunctionRef, "isFunction", 1);
	REGISTER_FUNC(IsClass, "isClass", 0);
	REGISTER_FUNC(IsClassRef, "isClass", 1);
	REGISTER_FUNC(IsSimple, "isSimple", 0);
	REGISTER_FUNC(IsSimpleRef, "isSimple", 1);
	REGISTER_FUNC(IsArray, "isArray", 0);
	REGISTER_FUNC(IsArrayRef, "isArray", 1);
	REGISTER_FUNC(IsPointer, "isPointer", 0);
	REGISTER_FUNC(IsPointerRef, "isPointer", 1);

	REGISTER_FUNC(MemberCount, "typeid::memberCount", 0);
	REGISTER_FUNC(MemberType, "typeid::memberType", 0);
	REGISTER_FUNC(MemberName, "typeid::memberName", 0);

	REGISTER_FUNC(TypeName, "typeid::name$", 0);

	REGISTER_FUNC(TypeSubType, "typeid::subType", 0);
	REGISTER_FUNC(TypeArraySize, "typeid::arraySize", 0);
	REGISTER_FUNC(TypeReturnType, "typeid::returnType", 0);
	REGISTER_FUNC(TypeArgumentCount, "typeid::argumentCount", 0);
	REGISTER_FUNC(TypeArgumentType, "typeid::argumentType", 0);

	REGISTER_FUNC(MemberByIndex, "typeGetMember", 0);
	REGISTER_FUNC(MemberByName, "typeGetMember", 1);

	REGISTER_FUNC(GetPointerTarget, "pointerGetTarget", 0);

	REGISTER_FUNC(GetType, "getType", 0);
	REGISTER_FUNC(GetInstanceByName, "createInstanceByName", 0);
	REGISTER_FUNC(GetInstanceByType, "createInstanceByType", 0);
	REGISTER_FUNC(GetArrayByName, "createArrayByName", 0);
	REGISTER_FUNC(GetArrayByType, "createArrayByType", 0);

	REGISTER_FUNC(GetFunctionContextType, "functionGetContextType", 0);
	REGISTER_FUNC(GetFunctionContext, "functionGetContext", 0);
	REGISTER_FUNC(SetFunctionContext, "functionSetContext", 0);

	return true;
}